

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O3

Statistics * __thiscall
asmjit::v1_14::JitAllocator::statistics(Statistics *__return_storage_ptr__,JitAllocator *this)

{
  Impl *pIVar1;
  size_t sVar2;
  long lVar3;
  size_t sVar4;
  size_t sVar5;
  long *plVar6;
  size_t sVar7;
  JitAllocatorPrivateImpl *impl;
  
  __return_storage_ptr__->_usedSize = 0;
  __return_storage_ptr__->_reservedSize = 0;
  __return_storage_ptr__->_overheadSize = 0;
  __return_storage_ptr__->_blockCount = 0;
  __return_storage_ptr__->_allocationCount = 0;
  pIVar1 = this->_impl;
  if (pIVar1 != (Impl *)JitAllocatorImpl_none) {
    pthread_mutex_lock((pthread_mutex_t *)(pIVar1 + 1));
    lVar3._0_4_ = pIVar1[5].granularity;
    lVar3._4_4_ = pIVar1[5].fillPattern;
    sVar2 = __return_storage_ptr__->_blockCount;
    if (lVar3 != 0) {
      sVar4 = __return_storage_ptr__->_usedSize;
      sVar7 = __return_storage_ptr__->_reservedSize;
      sVar5 = __return_storage_ptr__->_overheadSize;
      plVar6 = (long *)(*(long *)(pIVar1 + 5) + 0x40);
      do {
        sVar2 = sVar2 + *(uint *)(plVar6 + -5);
        sVar7 = sVar7 + (plVar6[-3] + plVar6[-4]) * (ulong)*(ushort *)((long)plVar6 + -0x24);
        sVar4 = sVar4 + (plVar6[-1] + plVar6[-2]) * (ulong)*(ushort *)((long)plVar6 + -0x24);
        sVar5 = sVar5 + *plVar6;
        plVar6 = plVar6 + 9;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
      __return_storage_ptr__->_reservedSize = sVar7;
      __return_storage_ptr__->_usedSize = sVar4;
      __return_storage_ptr__->_overheadSize = sVar5;
    }
    __return_storage_ptr__->_blockCount = sVar2;
    __return_storage_ptr__->_allocationCount = *(size_t *)(pIVar1 + 4);
    pthread_mutex_unlock((pthread_mutex_t *)(pIVar1 + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

JitAllocator::Statistics JitAllocator::statistics() const noexcept {
  Statistics statistics;
  statistics.reset();

  if (ASMJIT_LIKELY(_impl != &JitAllocatorImpl_none)) {
    JitAllocatorPrivateImpl* impl = static_cast<JitAllocatorPrivateImpl*>(_impl);
    LockGuard guard(impl->lock);

    size_t poolCount = impl->poolCount;
    for (size_t poolId = 0; poolId < poolCount; poolId++) {
      const JitAllocatorPool& pool = impl->pools[poolId];
      statistics._blockCount   += size_t(pool.blockCount);
      statistics._reservedSize += size_t(pool.totalAreaSize[0] + pool.totalAreaSize[1]) * pool.granularity;
      statistics._usedSize     += size_t(pool.totalAreaUsed[0] + pool.totalAreaUsed[1]) * pool.granularity;
      statistics._overheadSize += size_t(pool.totalOverheadBytes);
    }

    statistics._allocationCount = impl->allocationCount;
  }

  return statistics;
}